

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

char * Assimp::fast_atoreal_move<double>(char *c,double *out,bool check_comma)

{
  char cVar1;
  int iVar2;
  invalid_argument *this;
  uint64_t uVar3;
  double *pdVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_60;
  double exp;
  bool einv;
  double pl;
  uint diff;
  byte local_31;
  double dStack_30;
  bool inv;
  double f;
  double *pdStack_20;
  bool check_comma_local;
  double *out_local;
  char *c_local;
  
  dStack_30 = 0.0;
  local_31 = *c == '-';
  if (((bool)local_31) || (out_local = (double *)c, *c == '+')) {
    out_local = (double *)(c + 1);
  }
  f._7_1_ = check_comma;
  pdStack_20 = out;
  if (((*(char *)out_local == 'N') || (*(char *)out_local == 'n')) &&
     (iVar2 = ASSIMP_strincmp((char *)out_local,"nan",3), iVar2 == 0)) {
    dVar5 = std::numeric_limits<double>::quiet_NaN();
    *pdStack_20 = dVar5;
    c_local = (char *)((long)out_local + 3);
  }
  else if (((*(char *)out_local == 'I') || (*(char *)out_local == 'i')) &&
          (iVar2 = ASSIMP_strincmp((char *)out_local,"inf",3), iVar2 == 0)) {
    dVar5 = std::numeric_limits<double>::infinity();
    *pdStack_20 = dVar5;
    if ((local_31 & 1) != 0) {
      *pdStack_20 = -*pdStack_20;
    }
    out_local = (double *)((long)out_local + 3);
    if (((*(char *)out_local == 'I') || (*(char *)out_local == 'i')) &&
       (iVar2 = ASSIMP_strincmp((char *)out_local,"inity",5), iVar2 == 0)) {
      out_local = (double *)((long)out_local + 5);
    }
    c_local = (char *)out_local;
  }
  else {
    if (((*(char *)out_local < '0') || ('9' < *(char *)out_local)) &&
       ((((*(char *)out_local != '.' && (((f._7_1_ & 1) == 0 || (*(char *)out_local != ',')))) ||
         (*(char *)((long)out_local + 1) < '0')) || ('9' < *(char *)((long)out_local + 1))))) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this,
                 "Cannot parse string as real number: does not start with digit or decimal point followed by digit."
                );
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if ((*(char *)out_local != '.') && (((f._7_1_ & 1) == 0 || (*(char *)out_local != ',')))) {
      uVar3 = strtoul10_64((char *)out_local,(char **)&out_local,(uint *)0x0);
      auVar6._8_4_ = (int)(uVar3 >> 0x20);
      auVar6._0_8_ = uVar3;
      auVar6._12_4_ = 0x45300000;
      dStack_30 = (auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    }
    if (((*(char *)out_local == '.') || (((f._7_1_ & 1) != 0 && (*(char *)out_local == ',')))) &&
       (('/' < *(char *)((long)out_local + 1) && (*(char *)((long)out_local + 1) < ':')))) {
      out_local = (double *)((long)out_local + 1);
      pl._0_4_ = 0xf;
      uVar3 = strtoul10_64((char *)out_local,(char **)&out_local,(uint *)&pl);
      auVar7._8_4_ = (int)(uVar3 >> 0x20);
      auVar7._0_8_ = uVar3;
      auVar7._12_4_ = 0x45300000;
      dStack_30 = *(double *)(fast_atof_table + (ulong)pl._0_4_ * 8) *
                  ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) + dStack_30;
    }
    else if (*(char *)out_local == '.') {
      out_local = (double *)((long)out_local + 1);
    }
    if ((*(char *)out_local == 'e') || (*(char *)out_local == 'E')) {
      pdVar4 = (double *)((long)out_local + 1);
      cVar1 = *(char *)pdVar4;
      if ((cVar1 == '-') || (*(char *)pdVar4 == '+')) {
        pdVar4 = (double *)((long)out_local + 2);
      }
      out_local = pdVar4;
      uVar3 = strtoul10_64((char *)out_local,(char **)&out_local,(uint *)0x0);
      auVar8._8_4_ = (int)(uVar3 >> 0x20);
      auVar8._0_8_ = uVar3;
      auVar8._12_4_ = 0x45300000;
      local_60 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      if (cVar1 == '-') {
        local_60 = -local_60;
      }
      dVar5 = pow(10.0,local_60);
      dStack_30 = dVar5 * dStack_30;
    }
    if ((local_31 & 1) != 0) {
      dStack_30 = -dStack_30;
    }
    *pdStack_20 = dStack_30;
    c_local = (char *)out_local;
  }
  return c_local;
}

Assistant:

inline
const char* fast_atoreal_move(const char* c, Real& out, bool check_comma = true) {
    Real f = 0;

    bool inv = (*c == '-');
    if (inv || *c == '+') {
        ++c;
    }

    if ((c[0] == 'N' || c[0] == 'n') && ASSIMP_strincmp(c, "nan", 3) == 0) {
        out = std::numeric_limits<Real>::quiet_NaN();
        c += 3;
        return c;
    }

    if ((c[0] == 'I' || c[0] == 'i') && ASSIMP_strincmp(c, "inf", 3) == 0) {
        out = std::numeric_limits<Real>::infinity();
        if (inv) {
            out = -out;
        }
        c += 3;
        if ((c[0] == 'I' || c[0] == 'i') && ASSIMP_strincmp(c, "inity", 5) == 0) {
            c += 5;
        }
        return c;
     }

    if (!(c[0] >= '0' && c[0] <= '9') &&
            !((c[0] == '.' || (check_comma && c[0] == ',')) && c[1] >= '0' && c[1] <= '9')) {
        throw std::invalid_argument("Cannot parse string "
                                    "as real number: does not start with digit "
                                    "or decimal point followed by digit.");
    }

    if (*c != '.' && (! check_comma || c[0] != ',')) {
        f = static_cast<Real>( strtoul10_64 ( c, &c) );
    }

    if ((*c == '.' || (check_comma && c[0] == ',')) && c[1] >= '0' && c[1] <= '9') {
        ++c;

        // NOTE: The original implementation is highly inaccurate here. The precision of a single
        // IEEE 754 float is not high enough, everything behind the 6th digit tends to be more
        // inaccurate than it would need to be. Casting to double seems to solve the problem.
        // strtol_64 is used to prevent integer overflow.

        // Another fix: this tends to become 0 for long numbers if we don't limit the maximum
        // number of digits to be read. AI_FAST_ATOF_RELAVANT_DECIMALS can be a value between
        // 1 and 15.
        unsigned int diff = AI_FAST_ATOF_RELAVANT_DECIMALS;
        double pl = static_cast<double>( strtoul10_64 ( c, &c, &diff ));

        pl *= fast_atof_table[diff];
        f += static_cast<Real>( pl );
    }
    // For backwards compatibility: eat trailing dots, but not trailing commas.
    else if (*c == '.') {
        ++c;
    }

    // A major 'E' must be allowed. Necessary for proper reading of some DXF files.
    // Thanks to Zhao Lei to point out that this if() must be outside the if (*c == '.' ..)
    if (*c == 'e' || *c == 'E') {
        ++c;
        const bool einv = (*c=='-');
        if (einv || *c=='+') {
            ++c;
        }

        // The reason float constants are used here is that we've seen cases where compilers
        // would perform such casts on compile-time constants at runtime, which would be
        // bad considering how frequently fast_atoreal_move<float> is called in Assimp.
        Real exp = static_cast<Real>( strtoul10_64(c, &c) );
        if (einv) {
            exp = -exp;
        }
        f *= std::pow(static_cast<Real>(10.0), exp);
    }

    if (inv) {
        f = -f;
    }
    out = f;
    return c;
}